

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContext.h
# Opt level: O0

void __thiscall jaegertracing::SpanContext::SpanContext(SpanContext *this,SpanContext *ctx)

{
  uint64_t uVar1;
  SpanContext *ctx_local;
  SpanContext *this_local;
  
  opentracing::v3::SpanContext::SpanContext(&this->super_SpanContext);
  (this->super_SpanContext)._vptr_SpanContext = (_func_int **)&PTR__SpanContext_004f9420;
  uVar1 = (ctx->_traceID)._low;
  (this->_traceID)._high = (ctx->_traceID)._high;
  (this->_traceID)._low = uVar1;
  this->_spanID = ctx->_spanID;
  this->_parentID = ctx->_parentID;
  this->_flags = ctx->_flags;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->_baggage,&ctx->_baggage);
  std::__cxx11::string::string((string *)&this->_debugID,(string *)&ctx->_debugID);
  std::mutex::mutex(&this->_mutex);
  return;
}

Assistant:

SpanContext(const SpanContext& ctx)
        : _traceID(ctx._traceID)
        , _spanID(ctx._spanID)
        , _parentID(ctx._parentID)
        , _flags(ctx._flags)
        , _baggage(ctx._baggage)
        , _debugID(ctx._debugID)
    {
    }